

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

Queue * Queue_Fit(Queue *__return_storage_ptr__,Queue *q,size_t offset)

{
  size_t sVar1;
  Queue_Node *pQVar2;
  
  if ((offset != 0) && (sVar1 = q->size - offset, offset <= q->size && sVar1 != 0)) {
    __return_storage_ptr__->size = sVar1;
    pQVar2 = q->first;
    __return_storage_ptr__->first = pQVar2;
    __return_storage_ptr__->last = q->last;
    do {
      pQVar2 = pQVar2->prev;
      offset = offset - 1;
    } while (offset != 0);
    __return_storage_ptr__->first = pQVar2;
    return __return_storage_ptr__;
  }
  __assert_fail("q->size>offset && offset>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/queue.c"
                ,0x73,"struct Queue Queue_Fit(struct Queue *, size_t)");
}

Assistant:

struct Queue Queue_Fit(struct Queue *q,size_t offset)
{
	assert(q->size>offset && offset>0);

	struct Queue ret;
	size_t i;

	ret.size=q->size-offset;
	ret.first=q->first;
	ret.last=q->last;

	for(i=0;i<offset;++i)
	{
		ret.first=ret.first->prev;
	}
	return ret;
	
}